

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O1

mz_uint tdefl_create_comp_flags_from_zip_params(int level,int window_bits,int strategy)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  
  iVar1 = 10;
  if (level < 10) {
    iVar1 = level;
  }
  iVar3 = 6;
  if (-1 < level) {
    iVar3 = iVar1;
  }
  uVar4 = (uint)(level < 4) << 0xe |
          tdefl_write_image_to_png_file_in_memory_ex::s_tdefl_png_num_probes[iVar3];
  uVar2 = uVar4 | 0x1000;
  if (window_bits < 1) {
    uVar2 = uVar4;
  }
  if (level == 0) {
    return uVar2 | 0x80000;
  }
  switch(strategy) {
  case 1:
    return uVar2 | 0x20000;
  case 2:
    return uVar2 & 0xfffff000;
  case 3:
    uVar2 = uVar2 | 0x10000;
    break;
  case 4:
    return uVar2 | 0x40000;
  }
  return uVar2;
}

Assistant:

mz_uint tdefl_create_comp_flags_from_zip_params(int level, int window_bits,
                                                int strategy) {
  mz_uint comp_flags =
      s_tdefl_num_probes[(level >= 0) ? MZ_MIN(10, level) : MZ_DEFAULT_LEVEL] |
      ((level <= 3) ? TDEFL_GREEDY_PARSING_FLAG : 0);
  if (window_bits > 0)
    comp_flags |= TDEFL_WRITE_ZLIB_HEADER;

  if (!level)
    comp_flags |= TDEFL_FORCE_ALL_RAW_BLOCKS;
  else if (strategy == MZ_FILTERED)
    comp_flags |= TDEFL_FILTER_MATCHES;
  else if (strategy == MZ_HUFFMAN_ONLY)
    comp_flags &= ~TDEFL_MAX_PROBES_MASK;
  else if (strategy == MZ_FIXED)
    comp_flags |= TDEFL_FORCE_ALL_STATIC_BLOCKS;
  else if (strategy == MZ_RLE)
    comp_flags |= TDEFL_RLE_MATCHES;

  return comp_flags;
}